

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O1

bool helics::core::matchingTypes(string_view type1,string_view type2)

{
  int iVar1;
  const_iterator pvVar2;
  void *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  size_t in_RDI;
  bool bVar3;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  if (in_RDI == in_RDX) {
    if (in_RDI == 0) {
      return true;
    }
    iVar1 = bcmp(in_RSI,in_RCX,in_RDI);
    if (in_RDX == 0) {
      return true;
    }
    if (iVar1 == 0) {
      return true;
    }
  }
  else if (in_RDX == 0 || in_RDI == 0) {
    return true;
  }
  iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_20,0,3,"def");
  bVar3 = true;
  if (((iVar1 != 0) &&
      (iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                         (&local_30,0,3,"def"), iVar1 != 0)) &&
     (pvVar2 = frozen::
               set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
               ::find<std::basic_string_view<char,std::char_traits<char>>>
                         ((set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                           *)global_match_strings,&local_20), pvVar2 == (const_iterator)coreTypes))
  {
    pvVar2 = frozen::
             set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
             ::find<std::basic_string_view<char,std::char_traits<char>>>
                       ((set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                         *)global_match_strings,&local_30);
    bVar3 = pvVar2 != (const_iterator)coreTypes;
  }
  return bVar3;
}

Assistant:

bool matchingTypes(std::string_view type1, std::string_view type2)
{
    if (type1 == type2) {
        return true;
    }
    if ((type1.empty()) || (type2.empty())) {
        return true;
    }
    if ((type1.compare(0, 3, "def") == 0) || (type2.compare(0, 3, "def") == 0)) {
        return true;
    }
    const auto* res = global_match_strings.find(type1);
    if (res != global_match_strings.end()) {
        return true;
    }
    res = global_match_strings.find(type2);
    return (res != global_match_strings.end());
}